

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_smod(BtorSimBitVector *a,BtorSimBitVector *b)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  BtorSimBitVector *pBVar4;
  BtorSimBitVector *pBVar5;
  BtorSimBitVector *bv;
  BtorSimBitVector *bv_00;
  BtorSimBitVector *__ptr;
  BtorSimBitVector *__ptr_00;
  BtorSimBitVector *a_00;
  BtorSimBitVector *b_00;
  BtorSimBitVector *bv_01;
  BtorSimBitVector *b_01;
  uint32_t uVar6;
  BtorSimBitVector *a_01;
  
  if (a->width == 1) {
    pBVar4 = btorsim_bv_not(b);
    pBVar5 = btorsim_bv_and(a,pBVar4);
  }
  else {
    uVar6 = a->width - 1;
    bv = btorsim_bv_slice(a,uVar6,uVar6);
    uVar6 = b->width - 1;
    bv_00 = btorsim_bv_slice(b,uVar6,uVar6);
    _Var1 = btorsim_bv_is_true(bv);
    _Var2 = btorsim_bv_is_true(bv_00);
    __ptr = btorsim_bv_neg(a);
    __ptr_00 = btorsim_bv_neg(b);
    if (_Var1) {
      a = __ptr;
    }
    a_00 = btorsim_bv_copy(a);
    pBVar4 = b;
    if (_Var2) {
      pBVar4 = __ptr_00;
    }
    b_00 = btorsim_bv_copy(pBVar4);
    bv_01 = btorsim_bv_urem(a_00,b_00);
    _Var3 = btorsim_bv_is_zero(bv_01);
    if (_Var3) {
      b_01 = btorsim_bv_new(b->width);
    }
    else {
      b_01 = btorsim_bv_copy(b);
    }
    pBVar4 = btorsim_bv_neg(bv_01);
    pBVar5 = bv_01;
    if ((!_Var1 && !_Var2) ||
       ((a_01 = pBVar4, (~_Var1 & 1U) != 0 || _Var2 &&
        (a_01 = bv_01, pBVar5 = pBVar4, _Var1 || (~_Var2 & 1U) != 0)))) {
      pBVar5 = btorsim_bv_copy(pBVar5);
    }
    else {
      pBVar5 = btorsim_bv_add(a_01,b_01);
    }
    free(bv);
    free(bv_00);
    free(__ptr);
    free(__ptr_00);
    free(a_00);
    free(b_00);
    free(bv_01);
    free(b_01);
  }
  free(pBVar4);
  return pBVar5;
}

Assistant:

BtorSimBitVector *
btorsim_bv_smod (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  BtorSimBitVector *res = 0, *not_b, *sign_a, *sign_b, *neg_a, *neg_b, *add;
  BtorSimBitVector *cond_a, *cond_b, *urem, *neg_urem;
  bool a_positive, b_positive;

  if (a->width == 1)
  {
    not_b = btorsim_bv_not (b);
    res   = btorsim_bv_and (a, not_b);
    btorsim_bv_free (not_b);
  }
  else
  {
    sign_a = btorsim_bv_slice (a, a->width - 1, a->width - 1);
    sign_b = btorsim_bv_slice (b, b->width - 1, b->width - 1);
    a_positive = !btorsim_bv_is_true (sign_a);
    b_positive = !btorsim_bv_is_true (sign_b);

    neg_a  = btorsim_bv_neg (a);
    neg_b  = btorsim_bv_neg (b);
    cond_a = a_positive ? btorsim_bv_copy (a)
                        : btorsim_bv_copy (neg_a);
    cond_b = b_positive ? btorsim_bv_copy (b)
                        : btorsim_bv_copy (neg_b);


    urem     = btorsim_bv_urem (cond_a, cond_b);
    add = btorsim_bv_is_zero(urem) ? btorsim_bv_zero(b->width)
                                   : btorsim_bv_copy(b);

    neg_urem = btorsim_bv_neg (urem);

    res =  a_positive &&  b_positive ? btorsim_bv_copy(urem)
        : !a_positive &&  b_positive ? btorsim_bv_add(neg_urem, add)
        :  a_positive && !b_positive ? btorsim_bv_add(urem, add)
                                     : btorsim_bv_copy(neg_urem);

    btorsim_bv_free (sign_a);
    btorsim_bv_free (sign_b);
    btorsim_bv_free (neg_a);
    btorsim_bv_free (neg_b);
    btorsim_bv_free (cond_a);
    btorsim_bv_free (cond_b);
    btorsim_bv_free (urem);
    btorsim_bv_free (add);
    btorsim_bv_free (neg_urem);
  }

  assert (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}